

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O2

void test_2d_dynamic<0ul,5ul,1ul,30ul>(void)

{
  reference pvVar1;
  int j;
  ulong uVar2;
  pointer t;
  int j_1;
  pointer t_00;
  ulong local_58;
  value_type true_idx;
  vector<int,_std::allocator<int>_> data;
  
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x76,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",(bool *)&data,
             (bool *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x78,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,(int *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x79,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,(int *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1e;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x7b,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_00000023;
  true_idx = 0x23;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x7c,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,&true_idx);
  true_idx = CONCAT44(true_idx._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&data,0x23,(value_type_conflict1 *)&true_idx,(allocator_type *)&local_58);
  t = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  t_00 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  ;
  for (uVar2 = 0; uVar2 != 0x23; uVar2 = uVar2 + 1) {
    local_58 = uVar2;
    true_idx = uVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x8a,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_58,&true_idx);
    if (0x1d < uVar2) {
      *t_00 = 0x18;
      local_58._0_4_ = 0x18;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","24",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x9c,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",t_00,
                 (int *)&local_58);
      pvVar1 = std::vector<int,_std::allocator<int>_>::at(&data,uVar2);
      local_58 = CONCAT44(local_58._4_4_,0x18);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i, j)))","24",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x9f,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",pvVar1,
                 (int *)&local_58);
    }
    t_00 = t_00 + 1;
  }
  for (uVar2 = 0; uVar2 != 0x23; uVar2 = uVar2 + 1) {
    local_58 = uVar2;
    true_idx = uVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0xa9,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_58,&true_idx);
    if (uVar2 < 0x1e) {
      local_58 = CONCAT44(local_58._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0xc0,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",t,
                 (int *)&local_58);
    }
    else {
      local_58._0_4_ = 0x18;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","24",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0xb7,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",t,
                 (int *)&local_58);
      pvVar1 = std::vector<int,_std::allocator<int>_>::at(&data,uVar2);
      local_58 = CONCAT44(local_58._4_4_,0x18);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i, j)))","24",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0xba,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",pvVar1,
                 (int *)&local_58);
    }
    t = t + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_right<
        dimensions<dyn, dyn>, dimensions<1, 1>, dimensions<dyn, dyn>
    > const l{{X, Y}, {}, {N, M}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    // Initialize all elements to 42.
    std::vector<int> data(
        (l[0] + l.padding()[0]) * (l[1] + l.padding()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}